

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Header6::Decode(Header6 *this,KDataStream *stream,bool ignoreHeader)

{
  long lVar1;
  KUINT16 KVar2;
  ostream *poVar3;
  KException *this_00;
  undefined7 in_register_00000011;
  ulong uVar4;
  KStringStream ss;
  KString local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [50];
  char acStack_c8 [152];
  
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) != 0) {
    return;
  }
  KVar2 = KDataStream::GetBufferSize(stream);
  if (KVar2 < 0xc) {
    KVar2 = KDataStream::GetBufferSize(stream);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Received ",9);
    KDataStream::GetBufferSize(stream);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bytes. Expected minimum ",0x19);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," bytes.\nData: ",0xe);
    if (KVar2 != 0) {
      uVar4 = 0;
      do {
        lVar1 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar1 + 1] == '\0') {
          std::ios::widen((char)(ostream *)local_1a8 + (char)lVar1);
          acStack_c8[lVar1 + 1] = '\x01';
        }
        acStack_c8[lVar1] = '0';
        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        KDataStream::GetBuffer(stream);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        uVar4 = uVar4 + 1;
      } while (KVar2 != uVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Decode","");
    std::__cxx11::stringbuf::str();
    KException::KException<std::__cxx11::string>(this_00,&local_1f8,2,&local_1d8);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  KDataStream::Read(stream,&this->m_ui8ProtocolVersion);
  KDataStream::Read(stream,&this->m_ui8ExerciseID);
  KDataStream::Read(stream,&this->m_ui8PDUType);
  KDataStream::Read(stream,&this->m_ui8ProtocolFamily);
  (*(this->m_TimeStamp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_TimeStamp,stream);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16PDULength);
  KDataStream::Read(stream,&this->m_ui8Padding1);
  KDataStream::Read(stream,&this->m_ui8Padding2);
  return;
}

Assistant:

void Header6::Decode(KDataStream &stream, bool ignoreHeader /*= false*/  ) noexcept(false)
{
    if( !ignoreHeader )
    {
        if( stream.GetBufferSize() < HEADER6_PDU_SIZE )
        {
            const KUINT16 bufferSize = stream.GetBufferSize();
            KStringStream ss;
            ss << "Received " << stream.GetBufferSize() << " bytes. Expected minimum " << HEADER6_PDU_SIZE << " bytes.\nData: ";
            for(KUINT16 i = 0; i < bufferSize; i++)
            {
                ss << std::setfill('0') << std::setw(std::numeric_limits<KUOCTET>::digits/4) << std::hex << static_cast<KUINT32>(stream.GetBuffer()[i]) << " ";
            }
            ss << "\n";
            throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER, ss.str() );
        }

        stream >> m_ui8ProtocolVersion
               >> m_ui8ExerciseID
               >> m_ui8PDUType
               >> m_ui8ProtocolFamily
               >> KDIS_STREAM m_TimeStamp
               >> m_ui16PDULength
               >> m_ui8Padding1
               >> m_ui8Padding2;
    }
}